

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O0

void __thiscall adios2::profiling::JSONProfiler::JSONProfiler(JSONProfiler *this,Comm *comm)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  char (*in_stack_fffffffffffff9e8) [17];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffff9f0;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffad0;
  undefined1 uVar4;
  string *in_stack_fffffffffffffad8;
  string *name;
  JSONProfiler *in_stack_fffffffffffffae0;
  JSONProfiler *this_00;
  allocator local_4d1;
  string local_4d0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_4b0;
  undefined1 local_4a8;
  undefined4 local_4a0;
  allocator local_499;
  string local_498 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_478;
  undefined1 local_470;
  undefined4 local_468;
  allocator local_461;
  string local_460 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_440;
  undefined1 local_438;
  undefined4 local_430;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  undefined1 local_109 [40];
  undefined1 local_e1 [40];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffad0 >> 0x38);
  local_10 = in_RSI;
  IOChrono::IOChrono((IOChrono *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = local_10;
  *(undefined1 *)(in_RDI + 0x70) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"buffering",&local_31);
  AddTimerWatch(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(bool)uVar4);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"ES",&local_69);
  AddTimerWatch(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(bool)uVar4);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"PP",&local_91);
  AddTimerWatch(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(bool)uVar4);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"ES_meta1_gather",&local_b9);
  AddTimerWatch(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(bool)uVar4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  this_00 = (JSONProfiler *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"ES_meta2_gather",(allocator *)this_00);
  AddTimerWatch(this_00,in_stack_fffffffffffffad8,(bool)uVar4);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  name = (string *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_109 + 1),"ES_write_metadata",(allocator *)name);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string((string *)(local_109 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  paVar3 = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"MetadataBlockWrite",paVar3);
  uVar4 = (undefined1)((ulong)paVar3 >> 0x38);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"ES_AGG1",&local_159);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"ES_GatherMetadataBlocks",&local_181);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"ES_simple_meta",&local_1a9);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"ES_simple_gather",&local_1d1);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"ES_meta1",&local_1f9);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"ES_meta2",&local_221);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"ES_aggregate_info",&local_249);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"ES_gather_write_meta",&local_271);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"FixedMetaInfoGather",&local_299);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"MetaInfoBcast",&local_2c1);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"SelectMetaInfoGather",&local_2e9);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"ES_close",&local_311);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"ES_AWD",&local_339);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"WaitOnAsync",&local_361);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"BS_WaitOnAsync",&local_389);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"DC_WaitOnAsync1",&local_3b1);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"DC_WaitOnAsync2",&local_3d9);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"PDW",&local_401);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"DeriveVars",&local_429);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  local_430 = 0;
  pVar2 = std::
          unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::emplace<char_const(&)[10],int>
                    (in_stack_fffffffffffff9f0,(char (*) [10])in_stack_fffffffffffff9e8,
                     (int *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  local_440._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
       ._M_cur;
  local_438 = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"DataRead",&local_461);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  local_468 = 0;
  pVar2 = std::
          unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::emplace<char_const(&)[9],int>
                    (in_stack_fffffffffffff9f0,(char (*) [9])in_stack_fffffffffffff9e8,
                     (int *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  local_478._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
       ._M_cur;
  local_470 = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"MetaDataRead",&local_499);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  local_4a0 = 0;
  pVar2 = std::
          unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::emplace<char_const(&)[13],int>
                    (in_stack_fffffffffffff9f0,(char (*) [13])in_stack_fffffffffffff9e8,
                     (int *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  local_4b0._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
       ._M_cur;
  local_4a8 = pVar2.second;
  paVar3 = &local_4d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"MetaMetaDataRead",paVar3);
  AddTimerWatch(this_00,name,(bool)uVar4);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::
  unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::emplace<char_const(&)[17],int>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)paVar3,in_stack_fffffffffffff9e8,
             (int *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  iVar1 = helper::Comm::Rank((Comm *)0xd23de9);
  *(int *)(in_RDI + 0x78) = iVar1;
  return;
}

Assistant:

JSONProfiler::JSONProfiler(helper::Comm const &comm) : m_Comm(comm)
{
    m_Profiler.m_IsActive = true; // default is true

    AddTimerWatch("buffering");
    AddTimerWatch("ES");
    AddTimerWatch("PP");
    AddTimerWatch("ES_meta1_gather", false);
    AddTimerWatch("ES_meta2_gather", false);
    AddTimerWatch("ES_write_metadata", false);
    AddTimerWatch("MetadataBlockWrite", false);
    AddTimerWatch("ES_AGG1", false);
    AddTimerWatch("ES_GatherMetadataBlocks", false);
    AddTimerWatch("ES_simple_meta", false);
    AddTimerWatch("ES_simple_gather", false);

    AddTimerWatch("ES_meta1");
    AddTimerWatch("ES_meta2");

    AddTimerWatch("ES_aggregate_info", false);
    AddTimerWatch("ES_gather_write_meta", false);
    AddTimerWatch("FixedMetaInfoGather", false);
    AddTimerWatch("MetaInfoBcast", false);
    AddTimerWatch("SelectMetaInfoGather", false);

    AddTimerWatch("ES_close");
    AddTimerWatch("ES_AWD");
    AddTimerWatch("WaitOnAsync");
    AddTimerWatch("BS_WaitOnAsync");
    AddTimerWatch("DC_WaitOnAsync1");
    AddTimerWatch("DC_WaitOnAsync2");
    AddTimerWatch("PDW");

    AddTimerWatch("DeriveVars");

    m_Profiler.m_Bytes.emplace("buffering", 0);
    AddTimerWatch("DataRead");
    m_Profiler.m_Bytes.emplace("dataread", 0);
    AddTimerWatch("MetaDataRead");
    m_Profiler.m_Bytes.emplace("metadataread", 0);
    AddTimerWatch("MetaMetaDataRead");
    m_Profiler.m_Bytes.emplace("metadmetaataread", 0);

    m_RankMPI = m_Comm.Rank();
}